

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

archive_string_conv * get_sconv_object(archive *a,char *fc,char *tc,wchar_t flag)

{
  archive_string_conv *paVar1;
  int iVar2;
  char *__s;
  char *__s_00;
  archive_string_conv *paVar3;
  char *__ptr;
  char *pcVar4;
  wchar_t wVar5;
  archive_string_conv *paVar6;
  uint uVar7;
  
  if (a == (archive *)0x0) {
    paVar3 = (archive_string_conv *)0x0;
  }
  else {
    paVar3 = a->sconv;
    while ((paVar3 != (archive_string_conv *)0x0 &&
           ((iVar2 = strcmp(paVar3->from_charset,fc), iVar2 != 0 ||
            (iVar2 = strcmp(paVar3->to_charset,tc), iVar2 != 0))))) {
      paVar3 = paVar3->next;
    }
  }
  if (paVar3 != (archive_string_conv *)0x0) {
    return paVar3;
  }
  if (a == (archive *)0x0) {
    uVar7 = 0xffffffff;
  }
  else {
    uVar7 = a->current_codepage;
  }
  __s = canonical_charset_name(fc);
  __s_00 = canonical_charset_name(tc);
  paVar3 = (archive_string_conv *)calloc(1,0x58);
  if (paVar3 != (archive_string_conv *)0x0) {
    paVar3->next = (archive_string_conv *)0x0;
    __ptr = strdup(__s);
    paVar3->from_charset = __ptr;
    if (__ptr != (char *)0x0) {
      pcVar4 = strdup(__s_00);
      paVar3->to_charset = pcVar4;
      if (pcVar4 != (char *)0x0) {
        (paVar3->utftmp).s = (char *)0x0;
        (paVar3->utftmp).length = 0;
        (paVar3->utftmp).buffer_length = 0;
        if ((flag & 1U) == 0) {
          if ((flag & 2U) != 0) {
            paVar3->to_cp = uVar7;
            paVar3->from_cp = 0xffffffff;
          }
        }
        else {
          paVar3->from_cp = uVar7;
          paVar3->to_cp = 0xffffffff;
        }
        iVar2 = strcmp(__s,__s_00);
        wVar5 = L'\x01';
        if ((iVar2 != 0) && ((paVar3->from_cp == 0xffffffff || (paVar3->from_cp != paVar3->to_cp))))
        {
          wVar5 = L'\0';
        }
        paVar3->same = wVar5;
        iVar2 = strcmp(__s_00,"UTF-8");
        if (iVar2 == 0) {
          flag = flag | 0x100;
        }
        else {
          iVar2 = strcmp(__s_00,"UTF-16BE");
          if (iVar2 == 0) {
            flag = flag | 0x400;
          }
          else {
            iVar2 = strcmp(__s_00,"UTF-16LE");
            if (iVar2 == 0) {
              flag = flag | 0x1000;
            }
          }
        }
        iVar2 = strcmp(__s,"UTF-8");
        if (iVar2 == 0) {
          flag = flag | 0x200;
        }
        else {
          iVar2 = strcmp(__s,"UTF-16BE");
          if (iVar2 == 0) {
            flag = flag | 0x800;
          }
          else {
            iVar2 = strcmp(__s,"UTF-16LE");
            if (iVar2 == 0) {
              flag = flag | 0x2000;
            }
          }
        }
        wVar5 = flag | 0x40;
        if ((flag & 0x2a00U) == 0) {
          wVar5 = flag;
        }
        if ((flag & 2U) == 0) {
          wVar5 = flag;
        }
        paVar3->flag = wVar5;
        setup_converter(paVar3);
        goto LAB_003e3315;
      }
      free(__ptr);
    }
    free(paVar3);
  }
  paVar3 = (archive_string_conv *)0x0;
LAB_003e3315:
  if (paVar3 == (archive_string_conv *)0x0) {
    if (a != (archive *)0x0) {
      archive_set_error(a,0xc,"Could not allocate memory for a string conversion object");
      return (archive_string_conv *)0x0;
    }
  }
  else {
    if (paVar3->nconverter != L'\0') {
      if (a == (archive *)0x0) {
        return paVar3;
      }
      paVar1 = (archive_string_conv *)&a->sconv;
      do {
        paVar6 = paVar1;
        paVar1 = paVar6->next;
      } while (paVar1 != (archive_string_conv *)0x0);
      paVar6->next = paVar3;
      return paVar3;
    }
    if (a != (archive *)0x0) {
      archive_set_error(a,-1,"A character-set conversion not fully supported on this platform");
    }
    free_sconv_object(paVar3);
  }
  return (archive_string_conv *)0x0;
}

Assistant:

static struct archive_string_conv *
get_sconv_object(struct archive *a, const char *fc, const char *tc, int flag)
{
	struct archive_string_conv *sc;
	unsigned current_codepage;

	/* Check if we have made the sconv object. */
	sc = find_sconv_object(a, fc, tc);
	if (sc != NULL)
		return (sc);

	if (a == NULL)
		current_codepage = get_current_codepage();
	else
		current_codepage = a->current_codepage;

	sc = create_sconv_object(canonical_charset_name(fc),
	    canonical_charset_name(tc), current_codepage, flag);
	if (sc == NULL) {
		if (a != NULL)
			archive_set_error(a, ENOMEM,
			    "Could not allocate memory for "
			    "a string conversion object");
		return (NULL);
	}

	/*
	 * If there is no converter for current string conversion object,
	 * we cannot handle this conversion.
	 */
	if (sc->nconverter == 0) {
		if (a != NULL) {
#if HAVE_ICONV
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "iconv_open failed : Cannot handle ``%s''",
			    (flag & SCONV_TO_CHARSET)?tc:fc);
#else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "A character-set conversion not fully supported "
			    "on this platform");
#endif
		}
		/* Failed; free a sconv object. */
		free_sconv_object(sc);
		return (NULL);
	}

	/*
	 * Success!
	 */
	if (a != NULL)
		add_sconv_object(a, sc);
	return (sc);
}